

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NutDecompiler.cpp
# Opt level: O3

void __thiscall VMState::SetVar(VMState *this,int pos,ExpressionPtr *exp,bool expIsStatementLike)

{
  undefined8 *puVar1;
  pointer pSVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  ExpressionStatement *pEVar7;
  Error *this_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  ExpressionPtr assignExp;
  ExpressionPtr local_d8;
  element_type *local_c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b8;
  element_type *local_b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a8;
  shared_ptr<Statement> local_a0;
  StatementPtr local_90;
  ExpressionPtr local_80;
  element_type *local_70;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  BinaryOperatorExpression *local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  StatementPtr local_50;
  element_type *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  if ((-1 < pos) &&
     (pos < (int)((ulong)((long)(this->m_Stack).
                                super__Vector_base<VMState::StackElement,_std::allocator<VMState::StackElement>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->m_Stack).
                               super__Vector_base<VMState::StackElement,_std::allocator<VMState::StackElement>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333)) {
    local_80.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (exp->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_80.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (exp->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    if (local_80.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_80.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_80.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_80.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_80.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    bVar4 = InitVar(this,pos,&local_80,false);
    if (local_80.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_80.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (!bVar4) {
      iVar5 = (**((exp->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                 _vptr_Expression)();
      puVar1 = &((this->m_Stack).
                 super__Vector_base<VMState::StackElement,_std::allocator<VMState::StackElement>_>.
                 _M_impl.super__Vector_impl_data._M_start[(uint)pos].expression.
                 super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                _vptr_Expression;
      if ((puVar1 == (undefined8 *)0x0) || (iVar6 = (**(code **)*puVar1)(), iVar6 != 4)) {
        if (iVar5 == 5 || expIsStatementLike) {
          pEVar7 = (ExpressionStatement *)operator_new(0x28);
          local_70 = (exp->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          local_68._M_pi =
               (exp->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
          if (local_68._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_68._M_pi)->_M_use_count = (local_68._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_68._M_pi)->_M_use_count = (local_68._M_pi)->_M_use_count + 1;
            }
          }
          (pEVar7->super_Statement).super_enable_shared_from_this<Statement>._M_weak_this.
          super___weak_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
          (pEVar7->super_Statement).super_enable_shared_from_this<Statement>._M_weak_this.
          super___weak_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          (pEVar7->super_Statement)._vptr_Statement = (_func_int **)&PTR_GetType_0012b958;
          (pEVar7->m_Expression).super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          (pEVar7->m_Expression).super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               local_70;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (&(pEVar7->m_Expression).
                      super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                     &local_68);
          std::__shared_ptr<ExpressionStatement,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<ExpressionStatement,void>
                    ((__shared_ptr<ExpressionStatement,(__gnu_cxx::_Lock_policy)2> *)&local_d8,
                     pEVar7);
          if (local_68._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68._M_pi);
          }
          local_90.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)
               local_d8.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_90.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               local_d8.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          ;
          if (local_d8.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_d8.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              )->_M_use_count =
                   (local_d8.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_d8.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              )->_M_use_count =
                   (local_d8.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi)->_M_use_count + 1;
            }
          }
          PushStatement(this,&local_90);
          if (local_90.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_90.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          pSVar2 = (this->m_Stack).
                   super__Vector_base<VMState::StackElement,_std::allocator<VMState::StackElement>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_a0.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)
               local_d8.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_a0.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               local_d8.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          ;
          if (local_d8.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_d8.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              )->_M_use_count =
                   (local_d8.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_d8.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              )->_M_use_count =
                   (local_d8.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi)->_M_use_count + 1;
            }
          }
          std::vector<std::shared_ptr<Statement>,std::allocator<std::shared_ptr<Statement>>>::
          emplace_back<std::shared_ptr<Statement>>
                    ((vector<std::shared_ptr<Statement>,std::allocator<std::shared_ptr<Statement>>>
                      *)&pSVar2[(uint)pos].pendingStatements,&local_a0);
          if (local_a0.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_a0.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_d8.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_d8.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
        }
        else {
          std::vector<std::shared_ptr<Statement>,_std::allocator<std::shared_ptr<Statement>_>_>::
          clear(&(this->m_Stack).
                 super__Vector_base<VMState::StackElement,_std::allocator<VMState::StackElement>_>.
                 _M_impl.super__Vector_impl_data._M_start[(uint)pos].pendingStatements);
        }
        local_b0 = (exp->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_a8 = (exp->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
                   _M_pi;
        if (local_a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            local_a8->_M_use_count = local_a8->_M_use_count + 1;
            UNLOCK();
          }
          else {
            local_a8->_M_use_count = local_a8->_M_use_count + 1;
          }
        }
        ToTemporaryVariable(&local_d8);
        _Var8._M_pi = local_d8.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
        peVar3 = local_d8.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        pSVar2 = (this->m_Stack).
                 super__Vector_base<VMState::StackElement,_std::allocator<VMState::StackElement>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        local_d8.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_d8.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        this_00 = pSVar2[(uint)pos].expression.
                  super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        pSVar2 = pSVar2 + (uint)pos;
        (pSVar2->expression).super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             peVar3;
        (pSVar2->expression).super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = _Var8._M_pi;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        _Var8._M_pi = local_a8;
        if (local_d8.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_d8.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi);
          _Var8._M_pi = local_a8;
        }
      }
      else {
        local_d8.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)operator_new(0x30);
        pSVar2 = (this->m_Stack).
                 super__Vector_base<VMState::StackElement,_std::allocator<VMState::StackElement>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        local_c0 = pSVar2[(uint)pos].expression.
                   super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_b8._M_pi =
             pSVar2[(uint)pos].expression.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
        if (local_b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_b8._M_pi)->_M_use_count = (local_b8._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_b8._M_pi)->_M_use_count = (local_b8._M_pi)->_M_use_count + 1;
          }
        }
        local_40 = (exp->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_38._M_pi =
             (exp->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
        if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_38._M_pi)->_M_use_count = (local_38._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_38._M_pi)->_M_use_count = (local_38._M_pi)->_M_use_count + 1;
          }
        }
        (((BinaryOperatorExpression *)
         local_d8.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        super_OperatorExpression).super_Expression._vptr_Expression =
             (_func_int **)&PTR_GetType_0012bb68;
        (((BinaryOperatorExpression *)
         local_d8.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_arg1).
        super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        (((BinaryOperatorExpression *)
         local_d8.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_arg2).
        super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
        (((BinaryOperatorExpression *)
         local_d8.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_arg2).
        super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        (((BinaryOperatorExpression *)
         local_d8.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        super_OperatorExpression).m_operator = 0x3d;
        (((BinaryOperatorExpression *)
         local_d8.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_arg1).
        super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_c0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&(((BinaryOperatorExpression *)
                     local_d8.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    m_arg1).super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                   &local_b8);
        (((BinaryOperatorExpression *)
         local_d8.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_arg2).
        super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_40;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&(((BinaryOperatorExpression *)
                     local_d8.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    m_arg2).super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                   &local_38);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<BinaryOperatorExpression*>
                  (&local_d8.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                   (BinaryOperatorExpression *)
                   local_d8.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
        }
        if (local_b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8._M_pi);
        }
        pEVar7 = (ExpressionStatement *)operator_new(0x28);
        local_60 = (BinaryOperatorExpression *)
                   local_d8.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_58._M_pi =
             local_d8.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        if (local_d8.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_d8.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ->_M_use_count =
                 (local_d8.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_d8.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ->_M_use_count =
                 (local_d8.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi)->_M_use_count + 1;
          }
        }
        (pEVar7->super_Statement).super_enable_shared_from_this<Statement>._M_weak_this.
        super___weak_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
        (pEVar7->super_Statement).super_enable_shared_from_this<Statement>._M_weak_this.
        super___weak_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        (pEVar7->super_Statement)._vptr_Statement = (_func_int **)&PTR_GetType_0012b958;
        (pEVar7->m_Expression).super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        (pEVar7->m_Expression).super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             local_d8.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&(pEVar7->m_Expression).
                    super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount,&local_58
                  );
        std::__shared_ptr<Statement,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<ExpressionStatement,void>
                  ((__shared_ptr<Statement,(__gnu_cxx::_Lock_policy)2> *)&local_50,pEVar7);
        PushStatement(this,&local_50);
        if (local_50.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_50.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi);
        }
        _Var8._M_pi = local_d8.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
        if (local_58._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58._M_pi);
          _Var8._M_pi = local_d8.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi;
        }
      }
      if (_Var8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var8._M_pi);
      }
    }
    return;
  }
  this_01 = (Error *)__cxa_allocate_exception(0x28);
  Error::Error(this_01,"Accessing non valid stack position.");
  __cxa_throw(this_01,&Error::typeinfo,Error::~Error);
}

Assistant:

void SetVar( int pos, ExpressionPtr exp, bool expIsStatementLike = false )
	{
		if (pos < 0 || pos >= (int)m_Stack.size())
			throw Error("Accessing non valid stack position.");

		if (InitVar(pos, exp))
			return;

		if (exp->IsOperator())
			expIsStatementLike = true;

		if (m_Stack[pos].expression && m_Stack[pos].expression->GetType() == Exp_LocalVariable)
		{
			// Setting value to local variable - generate statement for this
			ExpressionPtr assignExp = ExpressionPtr(new BinaryOperatorExpression('=', m_Stack[pos].expression, exp));
			PushStatement(StatementPtr(new ExpressionStatement(assignExp)));
		}
		else
		{
			// Setting to intermediate variable
			if (expIsStatementLike)
			{
				// but expression itself may be used as statement - we must put it in pending state
				// and assure that it will be invoked only once, when not by usage of temporary
				// stack register that by explicit statement
				ExpressionStatementPtr statement = ExpressionStatementPtr(new ExpressionStatement(exp));
				PushStatement(statement);

				m_Stack[pos].pendingStatements.push_back(statement);
			}
			else
			{
				m_Stack[pos].pendingStatements.clear();
			}

			m_Stack[pos].expression = ToTemporaryVariable(exp);
		}
	}